

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O0

bool __thiscall
QSharedMemoryPosix::create(QSharedMemoryPosix *this,QSharedMemoryPrivate *self,qsizetype size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *__name;
  int *piVar4;
  __off64_t in_RDX;
  long in_FS_OFFSET;
  int ret;
  int errorNumber;
  int fd;
  QLatin1StringView function;
  QByteArray shmName;
  undefined4 in_stack_fffffffffffffec8;
  SharedMemoryError in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QLatin1String *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QSharedMemoryPosix *in_stack_ffffffffffffff00;
  QChar in_stack_ffffffffffffff2e;
  QSharedMemoryPrivate *in_stack_ffffffffffffff30;
  bool local_a9;
  QChar local_8a [25];
  QLatin1StringView local_58;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = handle(in_stack_ffffffffffffff00,
                 (QSharedMemoryPrivate *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QNativeIpcKey::nativeKey
              ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QString::~QString((QString *)0x8d2bb1);
    do {
      __name = QByteArray::constData((QByteArray *)0x8d2bc6);
      iVar2 = shm_open(__name,0x800c2,0x180);
      bVar1 = false;
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        bVar1 = *piVar4 == 4;
      }
    } while (bVar1);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      local_58.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_58.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      if (iVar2 == 0x16) {
        QSharedMemory::tr((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                          in_stack_fffffffffffffecc);
        QChar::QChar<char16_t,_true>(local_8a,L' ');
        QString::arg<QLatin1String,_true>
                  ((QString *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_ffffffffffffff2e);
        QSharedMemoryPrivate::setError
                  ((QSharedMemoryPrivate *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffecc,(QString *)0x8d2d15);
        QString::~QString((QString *)0x8d2d24);
        QString::~QString((QString *)0x8d2d31);
      }
      else {
        QSharedMemoryPrivate::setUnixErrorString(in_stack_ffffffffffffff30,_fd);
      }
      local_a9 = false;
    }
    else {
      do {
        iVar3 = ftruncate64(iVar2,in_RDX);
        bVar1 = false;
        if (iVar3 == -1) {
          piVar4 = __errno_location();
          bVar1 = *piVar4 == 4;
        }
      } while (bVar1);
      if (iVar3 == -1) {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        QSharedMemoryPrivate::setUnixErrorString(in_stack_ffffffffffffff30,_fd);
        qt_safe_close(in_stack_fffffffffffffed4);
        local_a9 = false;
      }
      else {
        qt_safe_close(in_stack_fffffffffffffed4);
        local_a9 = true;
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x8d2e80);
  }
  else {
    local_a9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a9;
}

Assistant:

bool QSharedMemoryPosix::create(QSharedMemoryPrivate *self, qsizetype size)
{
    if (!handle(self))
        return false;

    const QByteArray shmName = QFile::encodeName(self->nativeKey.nativeKey());

    int fd;
    QT_EINTR_LOOP(fd, ::shm_open(shmName.constData(), O_RDWR | O_CREAT | O_EXCL | O_CLOEXEC, 0600));
    if (fd == -1) {
        const int errorNumber = errno;
        const auto function = "QSharedMemory::attach (shm_open)"_L1;
        switch (errorNumber) {
        case EINVAL:
            self->setError(QSharedMemory::KeyError,
                           QSharedMemory::tr("%1: bad name").arg(function));
            break;
        default:
            self->setUnixErrorString(function);
        }
        return false;
    }

    // the size may only be set once
    int ret;
    QT_EINTR_LOOP(ret, QT_FTRUNCATE(fd, size));
    if (ret == -1) {
        self->setUnixErrorString("QSharedMemory::create (ftruncate)"_L1);
        qt_safe_close(fd);
        return false;
    }

    qt_safe_close(fd);

    return true;
}